

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtsp.c
# Opt level: O1

CURLcode rtsp_rtp_readwrite(SessionHandle *data,connectdata *conn,ssize_t *nread,_Bool *readmore)

{
  anon_union_224_10_26c073a1_for_proto *paVar1;
  int *piVar2;
  char **ppcVar3;
  SessionHandle *data_00;
  bool bVar4;
  int iVar5;
  char *pcVar6;
  curl_write_callback p_Var7;
  size_t sVar8;
  void *__dest;
  size_t __n;
  char *fmt;
  CURLcode CVar9;
  size_t sVar10;
  size_t sVar11;
  CURLcode local_5c;
  
  paVar1 = &conn->proto;
  pcVar6 = (conn->proto).ftpc.pp.cache;
  if (pcVar6 == (char *)0x0) {
    pcVar6 = (data->req).str;
    __n = *nread;
LAB_004df93c:
    local_5c = CURLE_OUT_OF_MEMORY;
    do {
      if (((long)__n < 1) || (*pcVar6 != '$')) goto LAB_004dfa91;
      if ((long)__n < 5) {
        *readmore = true;
        goto LAB_004dfa91;
      }
      *(uint *)((long)&conn->proto + 0x10) = (uint)(byte)pcVar6[1];
      sVar11 = (ulong)(ushort)(*(ushort *)(pcVar6 + 2) << 8 | *(ushort *)(pcVar6 + 2) >> 8) + 4;
      sVar10 = __n - sVar11;
      if ((long)__n < (long)sVar11) {
        *readmore = true;
        iVar5 = 5;
        sVar10 = __n;
      }
      else {
        data_00 = conn->data;
        p_Var7 = (data_00->set).fwrite_rtp;
        if (p_Var7 == (curl_write_callback)0x0) {
          p_Var7 = (data_00->set).fwrite_func;
        }
        sVar8 = (*p_Var7)(pcVar6,1,sVar11,(data_00->set).rtp_out);
        fmt = "Cannot pause RTP";
        if ((sVar8 == 0x10000001) || (fmt = "Failed writing RTP data", sVar8 != sVar11)) {
          bVar4 = false;
          Curl_failf(data_00,fmt);
          CVar9 = CURLE_WRITE_ERROR;
        }
        else {
          CVar9 = CURLE_OK;
          bVar4 = true;
        }
        if (bVar4) {
          pcVar6 = pcVar6 + sVar11;
          iVar5 = 0;
          if ((data->set).rtspreq == RTSPREQ_RECEIVE) {
            piVar2 = &(data->req).keepon;
            *(byte *)piVar2 = (byte)*piVar2 & 0xfe;
          }
        }
        else {
          Curl_failf(data,"Got an error writing an RTP packet");
          *readmore = false;
          (*Curl_cfree)((paVar1->ftpc).pp.cache);
          (paVar1->ftpc).pp.cache = (char *)0x0;
          (conn->proto).ftpc.pp.cache_size = 0;
          iVar5 = 1;
          sVar10 = __n;
          local_5c = CVar9;
        }
      }
      __n = sVar10;
    } while (iVar5 == 0);
    if (iVar5 != 5) {
      return local_5c;
    }
LAB_004dfa91:
    if ((__n == 0) || (*pcVar6 != '$')) {
      ppcVar3 = &(data->req).str;
      *ppcVar3 = *ppcVar3 + (*nread - __n);
      *nread = __n;
      (*Curl_cfree)((paVar1->ftpc).pp.cache);
      (paVar1->ftpc).pp.cache = (char *)0x0;
      (conn->proto).ftpc.pp.cache_size = 0;
    }
    else {
      __dest = (*Curl_cmalloc)(__n);
      if (__dest == (void *)0x0) {
        (*Curl_cfree)((paVar1->ftpc).pp.cache);
        (paVar1->ftpc).pp.cache = (char *)0x0;
        (conn->proto).ftpc.pp.cache_size = 0;
        goto LAB_004dfb32;
      }
      memcpy(__dest,pcVar6,__n);
      (*Curl_cfree)((conn->proto).ftpc.pp.cache);
      (conn->proto).generic = __dest;
      (conn->proto).rtspc.rtp_bufsize = __n;
      *nread = 0;
    }
    CVar9 = CURLE_OK;
  }
  else {
    pcVar6 = (char *)(*Curl_crealloc)(pcVar6,*nread + (conn->proto).ftpc.pp.cache_size);
    if (pcVar6 != (char *)0x0) {
      (conn->proto).ftpc.pp.cache = pcVar6;
      memcpy(pcVar6 + (conn->proto).ftpc.pp.cache_size,(data->req).str,*nread);
      pcVar6 = (conn->proto).ftpc.pp.cache;
      __n = (conn->proto).ftpc.pp.cache_size + *nread;
      (conn->proto).rtspc.rtp_bufsize = __n;
      goto LAB_004df93c;
    }
    (*Curl_cfree)((paVar1->ftpc).pp.cache);
    (paVar1->ftpc).pp.cache = (char *)0x0;
    (conn->proto).ftpc.pp.cache_size = 0;
LAB_004dfb32:
    CVar9 = CURLE_OUT_OF_MEMORY;
  }
  return CVar9;
}

Assistant:

static CURLcode rtsp_rtp_readwrite(struct SessionHandle *data,
                                   struct connectdata *conn,
                                   ssize_t *nread,
                                   bool *readmore) {
  struct SingleRequest *k = &data->req;
  struct rtsp_conn *rtspc = &(conn->proto.rtspc);

  char *rtp; /* moving pointer to rtp data */
  ssize_t rtp_dataleft; /* how much data left to parse in this round */
  char *scratch;
  CURLcode result;

  if(rtspc->rtp_buf) {
    /* There was some leftover data the last time. Merge buffers */
    char *newptr = realloc(rtspc->rtp_buf, rtspc->rtp_bufsize + *nread);
    if(!newptr) {
      Curl_safefree(rtspc->rtp_buf);
      rtspc->rtp_buf = NULL;
      rtspc->rtp_bufsize = 0;
      return CURLE_OUT_OF_MEMORY;
    }
    rtspc->rtp_buf = newptr;
    memcpy(rtspc->rtp_buf + rtspc->rtp_bufsize, k->str, *nread);
    rtspc->rtp_bufsize += *nread;
    rtp = rtspc->rtp_buf;
    rtp_dataleft = rtspc->rtp_bufsize;
  }
  else {
    /* Just parse the request buffer directly */
    rtp = k->str;
    rtp_dataleft = *nread;
  }

  while((rtp_dataleft > 0) &&
        (rtp[0] == '$')) {
    if(rtp_dataleft > 4) {
      int rtp_length;

      /* Parse the header */
      /* The channel identifier immediately follows and is 1 byte */
      rtspc->rtp_channel = RTP_PKT_CHANNEL(rtp);

      /* The length is two bytes */
      rtp_length = RTP_PKT_LENGTH(rtp);

      if(rtp_dataleft < rtp_length + 4) {
        /* Need more - incomplete payload*/
        *readmore = TRUE;
        break;
      }
      else {
        /* We have the full RTP interleaved packet
         * Write out the header including the leading '$' */
        DEBUGF(infof(data, "RTP write channel %d rtp_length %d\n",
              rtspc->rtp_channel, rtp_length));
        result = rtp_client_write(conn, &rtp[0], rtp_length + 4);
        if(result) {
          failf(data, "Got an error writing an RTP packet");
          *readmore = FALSE;
          Curl_safefree(rtspc->rtp_buf);
          rtspc->rtp_buf = NULL;
          rtspc->rtp_bufsize = 0;
          return result;
        }

        /* Move forward in the buffer */
        rtp_dataleft -= rtp_length + 4;
        rtp += rtp_length + 4;

        if(data->set.rtspreq == RTSPREQ_RECEIVE) {
          /* If we are in a passive receive, give control back
           * to the app as often as we can.
           */
          k->keepon &= ~KEEP_RECV;
        }
      }
    }
    else {
      /* Need more - incomplete header */
      *readmore = TRUE;
      break;
    }
  }

  if(rtp_dataleft != 0 && rtp[0] == '$') {
    DEBUGF(infof(data, "RTP Rewinding %zd %s\n", rtp_dataleft,
          *readmore ? "(READMORE)" : ""));

    /* Store the incomplete RTP packet for a "rewind" */
    scratch = malloc(rtp_dataleft);
    if(!scratch) {
      Curl_safefree(rtspc->rtp_buf);
      rtspc->rtp_buf = NULL;
      rtspc->rtp_bufsize = 0;
      return CURLE_OUT_OF_MEMORY;
    }
    memcpy(scratch, rtp, rtp_dataleft);
    Curl_safefree(rtspc->rtp_buf);
    rtspc->rtp_buf = scratch;
    rtspc->rtp_bufsize = rtp_dataleft;

    /* As far as the transfer is concerned, this data is consumed */
    *nread = 0;
    return CURLE_OK;
  }
  else {
    /* Fix up k->str to point just after the last RTP packet */
    k->str += *nread - rtp_dataleft;

    /* either all of the data has been read or...
     * rtp now points at the next byte to parse
     */
    if(rtp_dataleft > 0)
      DEBUGASSERT(k->str[0] == rtp[0]);

    DEBUGASSERT(rtp_dataleft <= *nread); /* sanity check */

    *nread = rtp_dataleft;
  }

  /* If we get here, we have finished with the leftover/merge buffer */
  Curl_safefree(rtspc->rtp_buf);
  rtspc->rtp_buf = NULL;
  rtspc->rtp_bufsize = 0;

  return CURLE_OK;
}